

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m256v_permute_cols(m256v *M,int *colperm)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint8_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  undefined1 *__s;
  undefined8 uStack_30;
  
  uVar1 = M->n_col;
  lVar8 = -((ulong)uVar1 + 0xf & 0xfffffffffffffff0);
  __s = &stack0xffffffffffffffd8 + lVar8;
  if (0 < (int)uVar1) {
    uVar14 = 0;
    *(undefined8 *)((long)&uStack_30 + lVar8) = 0x10285b;
    memset(__s,0,(ulong)uVar1);
    uVar1 = M->n_row;
    uVar5 = (ulong)uVar1 + 0xf & 0xfffffffffffffff0;
    uVar7 = (ulong)uVar1;
    uVar4 = uVar1;
    do {
      if (__s[uVar14] == '\0') {
        uVar2 = colperm[uVar14];
        if (uVar14 == uVar2) {
          __s[uVar14] = 1;
        }
        else {
          if (0 < (int)uVar1) {
            sVar3 = M->rstride;
            puVar11 = M->e + uVar14;
            uVar12 = 0;
            do {
              __s[uVar12 - uVar5] = *puVar11;
              uVar12 = uVar12 + 1;
              puVar11 = puVar11 + sVar3;
            } while (uVar1 != uVar12);
          }
          uVar12 = (ulong)uVar2;
          uVar13 = uVar14 & 0xffffffff;
          do {
            uVar9 = uVar12;
            lVar8 = (long)(int)uVar9;
            __s[lVar8] = 1;
            if (0 < (int)uVar4) {
              lVar10 = 0;
              do {
                lVar6 = M->rstride * lVar10;
                M->e[(int)uVar13 + lVar6] = M->e[lVar8 + lVar6];
                lVar10 = lVar10 + 1;
                uVar4 = M->n_row;
                uVar7 = (ulong)(int)uVar4;
              } while (lVar10 < (long)uVar7);
            }
            uVar12 = (ulong)(uint)colperm[lVar8];
            uVar13 = uVar9;
          } while (uVar14 != (uint)colperm[lVar8]);
          __s[uVar14] = 1;
          uVar4 = (uint)uVar7;
          if (0 < (int)uVar4) {
            lVar10 = 0;
            do {
              M->e[lVar8 + M->rstride * lVar10] = __s[lVar10 - uVar5];
              lVar10 = lVar10 + 1;
              uVar4 = M->n_row;
              uVar7 = (ulong)(int)uVar4;
            } while (lVar10 < (long)uVar7);
          }
        }
      }
      uVar14 = uVar14 + 1;
    } while ((long)uVar14 < (long)M->n_col);
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_cols)(MV_GEN_TYPE* M, const int* colperm)
{
	char visited[M->n_col];
	for (int i = 0; i < M->n_col; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(colbuf_mat, colbuf, M->n_row, 1);
	for (int i = 0; i < M->n_col; ++i) {
		if (visited[i])
			continue;
		if (colperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_col)(M, i, &colbuf_mat, 0);
		int e = i, e_next = colperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_col)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = colperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_col)(&colbuf_mat, 0, M, e);
	}
}